

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bro.cpp
# Opt level: O3

void __thiscall bro::bro(bro *this,int argc,char **argv)

{
  long lVar1;
  long lVar2;
  brotli_decoder dec;
  args_t args;
  ifstream ifs;
  brotli_decoder_state state;
  brotli_decoder local_e41;
  args_t local_e40;
  long local_e10;
  int local_e08;
  byte abStack_df0 [488];
  brotli_decoder_state local_c08;
  
  args_t::args_t(&local_e40,argc,argv);
  if (local_e40.fail == false) {
    std::ifstream::ifstream(&local_e10);
    if (local_e40.input_file != (char *)0x0) {
      std::ifstream::open((char *)&local_e10,(_Ios_Openmode)local_e40.input_file);
    }
    local_c08.max_backward_distance = 0;
    local_c08.log_file = (FILE *)0x0;
    local_c08.src = (char *)0x0;
    local_c08.bitptr = 0;
    local_c08.bitptr_max = 0;
    local_c08.dest = (char *)0x0;
    local_c08.dest_max = (char *)0x0;
    local_c08.bytes_written = 0;
    local_c08.ring_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c08.ring_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c08.ring_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((abStack_df0[*(long *)(local_e10 + -0x18)] & 3) == 0) {
      lVar1 = std::chrono::_V2::system_clock::now();
      std::istream::read((char *)&local_e10,0x12a1a0);
      local_c08.src = bro::tmp;
      local_c08._16_8_ = (ulong)(uint)(local_e08 << 3) << 0x20;
      local_c08.log_file = (FILE *)fopen("log.txt","wb");
      andyzip::brotli_decoder::decode(&local_e41,&local_c08);
      lVar2 = std::chrono::_V2::system_clock::now();
      printf("err=%d\n",(ulong)local_c08.error);
      printf("%d\n",local_c08.bytes_written & 0xffffffff);
      if (local_e40.verbose == true) {
        printf("Brotli decompression speed: %0.f MB/s\n",
               ((((double)CONCAT44(0x45300000,(int)(local_c08.bytes_written >> 0x20)) -
                 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_c08.bytes_written) - 4503599627370496.0)) *
               953.67431640625) / (double)(lVar2 - lVar1));
      }
    }
    if (local_c08.ring_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c08.ring_buffer.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c08.ring_buffer.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c08.ring_buffer.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::ifstream::~ifstream(&local_e10);
  }
  return;
}

Assistant:

bro(int argc, const char **argv) {
    args_t args(argc, argv);
    if (args.fail) return;

    #ifdef MSC_VER
      _setmode(_fileno(stdin), _O_BINARY);
      _setmode(_fileno(stdout), _O_BINARY);
    #endif

    std::ifstream ifs;
    if (args.input_file) {
      ifs.open(args.input_file, std::ios::binary);
    }

    std::istream &is = args.input_file ? static_cast<std::istream&>(ifs) : std::cin;
    
    //std::ostream os = !args.output_file ? std::cout : (std::ostream&)std::ofstream(args.output_file, std::ios::binary);

    andyzip::brotli_decoder dec;

    andyzip::brotli_decoder_state state;

    static char tmp[0x1000000];
    if (!ifs.bad() && !ifs.eof()) {
      auto start = std::chrono::high_resolution_clock::now();
      ifs.read(tmp, sizeof(tmp));
      state.src = tmp;
      state.bitptr = 0;
      state.bitptr_max = (std::uint32_t)(ifs.gcount() * 8);
      state.log_file = fopen("log.txt", "wb");
      dec.decode(state);
      auto end = std::chrono::high_resolution_clock::now();
      auto nanoseconds = std::chrono::duration_cast<std::chrono::nanoseconds>(end - start);
      printf("err=%d\n", (int)state.error);
      printf("%d\n", (int)state.bytes_written);
      if (args.verbose) {
        printf("Brotli decompression speed: %0.f MB/s\n", (1000000000.0/1024/1024) * state.bytes_written / nanoseconds.count());
      }
    }
  }